

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

sqlite3_int64 sqlite3_soft_heap_limit64(sqlite3_int64 n)

{
  int iVar1;
  sqlite3_int64 sVar2;
  sqlite3_mutex *psVar3;
  
  iVar1 = sqlite3_initialize();
  if (iVar1 != 0) {
    return -1;
  }
  if (mem0.mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(mem0.mutex);
  }
  sVar2 = mem0.alarmThreshold;
  if (n < 0) {
    psVar3 = mem0.mutex;
    if (mem0.mutex == (sqlite3_mutex *)0x0) {
      return mem0.alarmThreshold;
    }
  }
  else {
    mem0.nearlyFull = (int)(n <= sqlite3Stat.nowValue[0] && n != 0);
    if (mem0.mutex == (sqlite3_mutex *)0x0) {
      mem0.alarmThreshold = n;
      return sVar2;
    }
    mem0.alarmThreshold = n;
    (*sqlite3Config.mutex.xMutexLeave)(mem0.mutex);
    psVar3 = mem0.mutex;
    if (mem0.mutex == (sqlite3_mutex *)0x0) {
      return sVar2;
    }
    (*sqlite3Config.mutex.xMutexEnter)(mem0.mutex);
  }
  (*sqlite3Config.mutex.xMutexLeave)(psVar3);
  return sVar2;
}

Assistant:

SQLITE_API sqlite3_int64 sqlite3_soft_heap_limit64(sqlite3_int64 n){
  sqlite3_int64 priorLimit;
  sqlite3_int64 excess;
  sqlite3_int64 nUsed;
#ifndef SQLITE_OMIT_AUTOINIT
  int rc = sqlite3_initialize();
  if( rc ) return -1;
#endif
  sqlite3_mutex_enter(mem0.mutex);
  priorLimit = mem0.alarmThreshold;
  if( n<0 ){
    sqlite3_mutex_leave(mem0.mutex);
    return priorLimit;
  }
  mem0.alarmThreshold = n;
  nUsed = sqlite3StatusValue(SQLITE_STATUS_MEMORY_USED);
  mem0.nearlyFull = (n>0 && n<=nUsed);
  sqlite3_mutex_leave(mem0.mutex);
  excess = sqlite3_memory_used() - n;
  if( excess>0 ) sqlite3_release_memory((int)(excess & 0x7fffffff));
  return priorLimit;
}